

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::typed_array<mpt::reference<mpt::cycle>_>::insert
          (typed_array<mpt::reference<mpt::cycle>_> *this,long pos,reference<mpt::cycle> *val)

{
  bool bVar1;
  content<mpt::reference<mpt::cycle>_> *this_00;
  reference<mpt::cycle> *this_01;
  void *d;
  long len;
  reference<mpt::cycle> *val_local;
  long pos_local;
  typed_array<mpt::reference<mpt::cycle>_> *this_local;
  
  d = (void *)unique_array<mpt::reference<mpt::cycle>_>::length
                        (&this->super_unique_array<mpt::reference<mpt::cycle>_>);
  if (pos < 0) {
    val_local = (reference<mpt::cycle> *)((long)d + pos);
    if ((long)val_local < 0) {
      return false;
    }
  }
  else {
    val_local = (reference<mpt::cycle> *)pos;
    if ((long)d < pos) {
      d = (void *)pos;
    }
  }
  bVar1 = unique_array<mpt::reference<mpt::cycle>_>::reserve
                    (&this->super_unique_array<mpt::reference<mpt::cycle>_>,(long)d + 1);
  if (bVar1) {
    this_00 = reference<mpt::content<mpt::reference<mpt::cycle>_>_>::instance
                        ((reference<mpt::content<mpt::reference<mpt::cycle>_>_> *)this);
    this_01 = (reference<mpt::cycle> *)
              content<mpt::reference<mpt::cycle>_>::insert(this_00,(long)val_local);
    if (this_01 == (reference<mpt::cycle> *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      reference<mpt::cycle>::reference(this_01,val);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}